

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_ManPlaceRandom(Frc_Man_t *p)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  int *__ptr;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  uVar3 = p->nObjs;
  uVar9 = (ulong)(int)uVar3;
  __ptr = (int *)malloc(uVar9 << 2);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    __ptr[uVar4] = (int)uVar4;
  }
  for (lVar8 = 0; lVar8 < (int)uVar9; lVar8 = lVar8 + 1) {
    uVar3 = Gia_ManRandom(0);
    uVar9 = (ulong)(uint)p->nObjs;
    uVar3 = uVar3 % (uint)p->nObjs;
    iVar1 = __ptr[lVar8];
    __ptr[lVar8] = __ptr[(int)uVar3];
    __ptr[(int)uVar3] = iVar1;
  }
  iVar1 = p->nObjData;
  iVar7 = 0;
  piVar6 = __ptr;
  while ((iVar7 < iVar1 && (piVar2 = p->pObjData, piVar2 != (int *)0x0))) {
    piVar2[(long)iVar7 + 4] = *piVar6;
    iVar7 = piVar2[(long)iVar7 + 1] + ((uint)piVar2[iVar7] >> 4) + iVar7 + 6;
    piVar6 = piVar6 + 1;
  }
  free(__ptr);
  return;
}

Assistant:

void Frc_ManPlaceRandom( Frc_Man_t * p )
{
    Frc_Obj_t * pThis;
    int * pPlacement;
    int i, h, Temp, iNext, Counter;
    pPlacement = ABC_ALLOC( int, p->nObjs );
    for ( i = 0; i < p->nObjs; i++ )
        pPlacement[i] = i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        iNext = Gia_ManRandom( 0 ) % p->nObjs;
        Temp = pPlacement[i];
        pPlacement[i] = pPlacement[iNext];
        pPlacement[iNext] = Temp;
    }
    Counter = 0;
    Frc_ManForEachObj( p, pThis, h )
        pThis->pPlace = pPlacement[Counter++];
    ABC_FREE( pPlacement );
}